

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O1

void __thiscall
Fifteen::moveGraphicTile(Fifteen *this,size_t rowSrc,size_t colSrc,size_t rowDst,size_t colDst)

{
  pointer puVar1;
  __uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_> _Var2;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *pvVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  QIcon nullIcon;
  QPixmap pixmap;
  QColor QStack_68;
  QColor local_58;
  int local_40;
  __uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_> local_38;
  
  pvVar3 = TilesBoard::getTiles
                     ((this->tilesBoard)._M_t.
                      super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                      super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                      super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  Controller::getBoardAttributes((Controller *)&local_40);
  uVar7 = rowDst * (long)local_38._M_t.
                         super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>
                         .super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl + colDst;
  puVar1 = (pvVar3->
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(pvVar3->
                super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  uVar6 = uVar7;
  if ((uVar7 < uVar5) &&
     (uVar6 = (long)local_38._M_t.
                    super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
                    super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl * rowSrc + colSrc,
     uVar6 < uVar5)) {
    _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
    super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
         puVar1[uVar7]._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
         _M_t;
    QAbstractButton::icon();
    QAbstractButton::setIcon
              ((QIcon *)_Var2._M_t.
                        super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                        super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
    QIcon::~QIcon((QIcon *)&local_58);
    QPixmap::QPixmap((QPixmap *)&local_58,local_40,local_40);
    QColor::QColor(&QStack_68,white);
    QPixmap::fill(&local_58);
    QIcon::QIcon((QIcon *)&QStack_68,(QPixmap *)&local_58);
    rowSrc = rowSrc * (long)local_38._M_t.
                            super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>
                            .super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl + colSrc;
    puVar1 = (pvVar3->
             super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (rowSrc < (ulong)((long)(pvVar3->
                               super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
      QAbstractButton::setIcon
                ((QIcon *)puVar1[rowSrc]._M_t.
                          super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t
                );
      QIcon::~QIcon((QIcon *)&QStack_68);
      QPixmap::~QPixmap((QPixmap *)&local_58);
      return;
    }
  }
  else {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
  }
  uVar4 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     rowSrc);
  QPixmap::~QPixmap((QPixmap *)&local_58);
  _Unwind_Resume(uVar4);
}

Assistant:

void Fifteen::moveGraphicTile( size_t rowSrc, size_t colSrc, size_t rowDst, size_t colDst )
{
    auto& tiles = tilesBoard->getTiles();
    const auto [ boardSize, tileSize ] = controller->getBoardAttributes();

    tiles.at( rowDst * boardSize + colDst )->setIcon( tiles.at( rowSrc * boardSize + colSrc )->icon() );
    QPixmap pixmap( tileSize, tileSize );
    pixmap.fill( Qt::white );
    QIcon nullIcon( pixmap );
    tiles.at( rowSrc * boardSize + colSrc )->setIcon( nullIcon );
}